

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cc
# Opt level: O2

NodeData * __thiscall IndexTree::search(IndexTree *this,PolarString *key)

{
  int iVar1;
  Node *pNVar2;
  long *__s1;
  long lVar3;
  int iVar4;
  int32_t *piVar5;
  int64_t *fast_this;
  
  piVar5 = this->root_node;
  pNVar2 = this->nodes;
  __s1 = (long *)key->data_;
  do {
    while( true ) {
      iVar1 = *piVar5;
      if (iVar1 == -1) {
        return &INDEX_NOT_FOUND;
      }
      lVar3 = *__s1;
      if (lVar3 == *(long *)pNVar2[iVar1].key) break;
      if (*(long *)pNVar2[iVar1].key <= lVar3) goto LAB_00104875;
LAB_0010486b:
      piVar5 = &pNVar2[iVar1].left;
    }
    iVar4 = strcmp((char *)__s1,pNVar2[iVar1].key);
    if (iVar4 < 0) goto LAB_0010486b;
    if (iVar4 == 0) {
      return &pNVar2[iVar1].data;
    }
LAB_00104875:
    piVar5 = &pNVar2[iVar1].right;
  } while( true );
}

Assistant:

const IndexTree::NodeData &IndexTree::search(const PolarString &key) {
    auto current = *root_node;
    while (current != -1) {
        auto result = fast_string_cmp(key.data(), nodes[current].key);
        if (result == 0) break;
        current = result < 0 ? nodes[current].left : nodes[current].right;
    }
    if (__glibc_unlikely(current == -1)) return INDEX_NOT_FOUND;
    else return nodes[current].data;
}